

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void move_right(int *angle,int *thrust,int vdistance,int dhs)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar1 = HS;
  iVar6 = 0;
  iVar5 = -0x16;
  if (dhs < HS) {
    iVar5 = 0;
  }
  iVar4 = 0xf;
  if (iVar5 - R < 0xf) {
    iVar4 = iVar5 - R;
  }
  iVar3 = -0xf;
  if (-0xf < iVar4) {
    iVar3 = iVar4;
  }
  *angle = iVar3 + R;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar5);
  poVar2 = std::operator<<(poVar2,"/");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,R);
  poVar2 = std::operator<<(poVar2,"/");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*angle);
  std::endl<char,std::char_traits<char>>(poVar2);
  if (dhs < iVar1) {
    if (500 < vdistance) {
      iVar6 = -0x14;
    }
    iVar1 = (uint)(VS < iVar6) * 2 + 2;
  }
  else {
    iVar1 = 4;
  }
  *thrust = iVar1;
  return;
}

Assistant:

void move_right(int& angle, int& thrust, int vdistance, int dhs = 30)
{
    int desired = dhs < HS ? 0 : -TrueAngle;
    angle = R + std::max(std::min(desired - R, 15), -15);
    std::cerr << desired << "/" << R << "/" << angle << std::endl;
    if (0 != desired)
    {
        thrust = 4;
    }
    else
    {
        thrust = (500 < vdistance ? -20 : 0) > VS ? 4 : 2;
    }
}